

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

QRect __thiscall QTableView::visualRect(QTableView *this,QModelIndex *index)

{
  QSpanCollection *this_00;
  QTableViewPrivate *this_01;
  QAbstractItemModel *pQVar1;
  undefined1 *puVar2;
  quintptr qVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Span *pSVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QRect QVar13;
  QRect QVar14;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < index->r) && (-1 < index->c)) &&
     (this_01 = *(QTableViewPrivate **)
                 &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                  super_QWidget.field_0x8,
     (index->m).ptr == (this_01->super_QAbstractItemViewPrivate).model)) {
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_58._0_8_ = (undefined1 *)0xffffffffffffffff;
      local_58.i = 0;
      local_58.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x68))(&local_58,pQVar1,index);
    }
    cVar4 = comparesEqual(&(this_01->super_QAbstractItemViewPrivate).root,&local_58);
    if (cVar4 != '\0') {
      this_00 = &this_01->spans;
      if ((QSpanCollection *)
          (this_01->spans).spans.
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next == this_00) {
        cVar4 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget + 0x2c0))(this,index);
        if (cVar4 != '\0') goto LAB_00596a61;
      }
      if (((this_01->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_01->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_01->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_01->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      if ((QSpanCollection *)
          (this_00->spans).
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next == this_00) {
        uVar5 = QHeaderView::sectionViewportPosition
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x588),index->r);
        uVar12 = (ulong)uVar5;
        iVar6 = QHeaderView::sectionSize
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x588),index->r);
        uVar7 = QHeaderView::sectionViewportPosition
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x580),index->c);
        QVar14.y1.m_i = 0;
        QVar14.x1.m_i = uVar7;
        iVar8 = QHeaderView::sectionSize
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x580),index->c);
        uVar9 = ~(uint)*(byte *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea
                                           .super_QFrame.super_QWidget.field_0x8 + 0x540);
        QVar14.x2.m_i = iVar8 + uVar7 + uVar9;
        QVar14.y2.m_i = 0;
        uVar11 = (ulong)(iVar6 + uVar5 + uVar9);
      }
      else {
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        local_58.m.ptr._0_4_ = 0xaaaaaaaa;
        qVar3._0_4_ = index->r;
        qVar3._4_4_ = index->c;
        puVar2 = *(undefined1 **)index;
        pSVar10 = QSpanCollection::spanAt(this_00,index->c,index->r);
        if (pSVar10 == (Span *)0x0) {
          local_58.m.ptr = local_58.m.ptr & 0xffffffffffffff00;
          local_58._0_8_ = puVar2;
          local_58.i = qVar3;
        }
        else {
          local_58.m.ptr._0_4_ = *(undefined4 *)&pSVar10->will_be_deleted;
          local_58.i._0_4_ = pSVar10->m_bottom;
          local_58.i._4_4_ = pSVar10->m_right;
          local_58._0_8_ = *(undefined1 **)pSVar10;
        }
        QVar14 = QTableViewPrivate::visualSpanRect(this_01,(Span *)&local_58);
        uVar12 = QVar14._0_8_ >> 0x20;
        uVar11 = QVar14._8_8_ >> 0x20;
      }
      goto LAB_00596a72;
    }
  }
LAB_00596a61:
  uVar12 = 0;
  uVar11 = 0xffffffff;
  QVar14 = (QRect)(ZEXT816(0xffffffff) << 0x40);
LAB_00596a72:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar13._0_8_ = QVar14._0_8_ & 0xffffffff | uVar12 << 0x20;
    QVar13._8_8_ = QVar14._8_8_ & 0xffffffff | uVar11 << 0x20;
    return QVar13;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableView::visualRect(const QModelIndex &index) const
{
    Q_D(const QTableView);
    if (!d->isIndexValid(index) || index.parent() != d->root
        || (!d->hasSpans() && isIndexHidden(index)))
        return QRect();

    d->executePostedLayout();

    if (d->hasSpans()) {
        QSpanCollection::Span span = d->span(index.row(), index.column());
        return d->visualSpanRect(span);
    }

    int rowp = rowViewportPosition(index.row());
    int rowh = rowHeight(index.row());
    int colp = columnViewportPosition(index.column());
    int colw = columnWidth(index.column());

    const int i = showGrid() ? 1 : 0;
    return QRect(colp, rowp, colw - i, rowh - i);
}